

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_token.c
# Opt level: O0

gtoken_t token_special_builtin(gtoken_s *token)

{
  uint32_t uVar1;
  char *s1;
  int iVar2;
  int32_t len;
  char *buffer;
  gtoken_s *token_local;
  
  s1 = token->value;
  uVar1 = token->bytes;
  switch(uVar1) {
  case 8:
    iVar2 = string_casencmp(s1,"__LINE__",(long)(int)uVar1);
    if (iVar2 == 0) {
      token->builtin = BUILTIN_LINE;
      return TOK_NUMBER;
    }
    iVar2 = string_casencmp(s1,"__FILE__",(long)(int)uVar1);
    if (iVar2 == 0) {
      token->builtin = BUILTIN_FILE;
      return TOK_STRING;
    }
    break;
  case 9:
    iVar2 = string_casencmp(s1,"__CLASS__",(long)(int)uVar1);
    if (iVar2 == 0) {
      token->builtin = BUILTIN_CLASS;
      return TOK_STRING;
    }
    break;
  case 10:
    iVar2 = string_casencmp(s1,"__COLUMN__",(long)(int)uVar1);
    if (iVar2 == 0) {
      token->builtin = BUILTIN_COLUMN;
      return TOK_NUMBER;
    }
    break;
  case 0xc:
    iVar2 = string_casencmp(s1,"__FUNCTION__",(long)(int)uVar1);
    if (iVar2 == 0) {
      token->builtin = BUILTIN_FUNC;
      return TOK_STRING;
    }
  }
  return TOK_IDENTIFIER;
}

Assistant:

gtoken_t token_special_builtin(gtoken_s *token) {
    const char *buffer = token->value;
    int32_t len = token->bytes;

    switch (len) {
        case 8:
            if (string_casencmp(buffer, "__LINE__", len) == 0) {
                token->builtin = BUILTIN_LINE;
                return TOK_NUMBER;
            }
            if (string_casencmp(buffer, "__FILE__", len) == 0) {
                token->builtin = BUILTIN_FILE;
                return TOK_STRING;
            }
            break;

        case 9:
            if (string_casencmp(buffer, "__CLASS__", len) == 0) {
                token->builtin = BUILTIN_CLASS;
                return TOK_STRING;
            }
            break;

        case 10:
            if (string_casencmp(buffer, "__COLUMN__", len) == 0) {
                token->builtin = BUILTIN_COLUMN;
                return TOK_NUMBER;
            }
            break;

        case 12:
            if (string_casencmp(buffer, "__FUNCTION__", len) == 0) {
                token->builtin = BUILTIN_FUNC;
                return TOK_STRING;
            }
            break;
    }

    return TOK_IDENTIFIER;
}